

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ADE_DEP_DPFSP.cpp
# Opt level: O1

void __thiscall
ADE_DEP_DPFSP::LS1EXC
          (ADE_DEP_DPFSP *this,Permutazione *p,uint iF,int *indiciFabbriche,uint *cFabbriche)

{
  unsigned_short uVar1;
  int iVar2;
  unsigned_short *puVar3;
  uint uVar4;
  uint uVar5;
  unsigned_short *risultato;
  ulong uVar6;
  ushort uVar7;
  bool bVar8;
  unsigned_short uVar9;
  ushort d;
  uint uVar10;
  ulong uVar11;
  ushort uVar12;
  ushort uVar13;
  IndiciRandom indRand;
  ushort local_a6;
  ushort local_a4;
  IndiciRandom local_48;
  
  uVar10 = (indiciFabbriche[iF + 1] - indiciFabbriche[iF]) + 1;
  local_48.vettoreIndici = (unsigned_short *)0x3200000002;
  uVar4 = std::uniform_int_distribution<int>::operator()
                    ((uniform_int_distribution<int> *)&local_48,&genRand.gen,(param_type *)&local_48
                    );
  d = (ushort)uVar10;
  if (d < (ushort)uVar4) {
    uVar4 = uVar10;
  }
  risultato = (unsigned_short *)operator_new__((ulong)((uVar4 & 0xffff) * 2));
  IndiciRandom::IndiciRandom(&local_48,&genRand,d);
  uVar9 = (unsigned_short)uVar4;
  IndiciRandom::generaIndici(&local_48,risultato,uVar9);
  uVar10 = (uint)(ushort)cFabbriche[iF >> 1];
  if (uVar9 < 2) {
    uVar6 = 0;
    uVar11 = 0;
    bVar8 = false;
  }
  else {
    uVar6 = 1;
    uVar7 = 0;
    bVar8 = false;
    do {
      if ((ushort)(uVar7 + 1) < uVar9) {
        uVar12 = risultato[uVar7] + (short)indiciFabbriche[iF];
        uVar11 = uVar6 & 0xffff;
        do {
          iVar2 = indiciFabbriche[iF];
          uVar13 = risultato[uVar11] + (short)iVar2;
          puVar3 = p->individuo;
          uVar1 = puVar3[uVar12];
          puVar3[uVar12] = puVar3[uVar13];
          puVar3[uVar13] = uVar1;
          uVar5 = valutaIndividuoParziale(this,puVar3 + iVar2,d);
          if ((uVar5 & 0xffff) < (uVar10 & 0xffff)) {
            bVar8 = true;
            uVar10 = uVar5;
            local_a6 = uVar12;
            local_a4 = uVar13;
          }
          puVar3 = p->individuo;
          uVar1 = puVar3[uVar12];
          puVar3[uVar12] = puVar3[uVar13];
          puVar3[uVar13] = uVar1;
          uVar11 = uVar11 + 1;
        } while (uVar11 < (uVar4 & 0xffff));
      }
      uVar7 = uVar7 + 1;
      uVar6 = (ulong)((int)uVar6 + 1);
    } while ((int)(uint)uVar7 < (int)((uVar4 & 0xffff) - 1));
    uVar6 = (ulong)local_a6;
    uVar11 = (ulong)local_a4;
  }
  if (bVar8) {
    puVar3 = p->individuo;
    uVar9 = puVar3[uVar6];
    puVar3[uVar6] = puVar3[uVar11];
    puVar3[uVar11] = uVar9;
    cFabbriche[iF >> 1] = uVar10 & 0xffff;
  }
  operator_delete__(risultato);
  IndiciRandom::~IndiciRandom(&local_48);
  return;
}

Assistant:

void ADE_DEP_DPFSP::LS1EXC(Permutazione* p, unsigned int iF, int* indiciFabbriche, unsigned int* cFabbriche) {
	
	unsigned short dimensioneFabbrica = indiciFabbriche[iF + 1] - indiciFabbriche[iF] + 1;

	unsigned short  posizioniDaSelezionare = min(dimensioneFabbrica, (unsigned short)genRand.randIntU(2, 50));

	unsigned short* indici = new unsigned short[posizioniDaSelezionare];
	
	IndiciRandom indRand(&genRand, dimensioneFabbrica);

	indRand.generaIndici(indici, posizioniDaSelezionare);

	bool miglioramento = false;
	unsigned short miglioreIndice1, miglioreIndice2, nuovoCosto, miglioreCosto = cFabbriche[iF / 2],
		indice1, indice2, tmp;

	for (unsigned short i = 0; i < posizioniDaSelezionare - 1; i++) {
		indice1 = indiciFabbriche[iF] + indici[i];

		for (unsigned short j = i + 1; j < posizioniDaSelezionare; j++) {
			indice2 = indiciFabbriche[iF] + indici[j];

			tmp = p->individuo[indice1];
			p->individuo[indice1] = p->individuo[indice2];
			p->individuo[indice2] = tmp;

			nuovoCosto = valutaIndividuoParziale(&p->individuo[indiciFabbriche[iF]], dimensioneFabbrica);
			if (nuovoCosto < miglioreCosto) {
				miglioreCosto = nuovoCosto;
				miglioreIndice1 = indice1;
				miglioreIndice2 = indice2;
				miglioramento = true;
			}

			tmp = p->individuo[indice1];
			p->individuo[indice1] = p->individuo[indice2];
			p->individuo[indice2] = tmp;
		}
	}

	if (miglioramento) {
		tmp = p->individuo[miglioreIndice1];
		p->individuo[miglioreIndice1] = p->individuo[miglioreIndice2];
		p->individuo[miglioreIndice2] = tmp;

		cFabbriche[iF / 2] = miglioreCosto;
	}

	delete[] indici;
}